

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O2

void __thiscall
aeron::ClientConductor::releaseExclusivePublication(ClientConductor *this,int64_t registrationId)

{
  pointer pEVar1;
  long lVar2;
  long lVar3;
  pointer pEVar4;
  const_iterator __position;
  
  verifyDriverIsActiveViaErrorHandler(this);
  std::recursive_mutex::lock(&this->m_adminLock);
  pEVar4 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->m_exclusivePublications).
           super__Vector_base<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pEVar1 - (long)pEVar4;
  pEVar4 = pEVar4 + 2;
  for (lVar2 = lVar3 / 0x90 >> 2; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (pEVar4[-2].m_registrationId == registrationId) {
      __position._M_current = pEVar4 + -2;
      goto LAB_00148d2c;
    }
    if (pEVar4[-1].m_registrationId == registrationId) {
      __position._M_current = pEVar4 + -1;
      goto LAB_00148d2c;
    }
    __position._M_current = pEVar4;
    if (pEVar4->m_registrationId == registrationId) goto LAB_00148d2c;
    if (pEVar4[1].m_registrationId == registrationId) {
      __position._M_current = pEVar4 + 1;
      goto LAB_00148d2c;
    }
    pEVar4 = pEVar4 + 4;
    lVar3 = lVar3 + -0x240;
  }
  lVar3 = lVar3 / 0x90;
  __position._M_current = pEVar4 + -2;
  if (lVar3 == 1) {
LAB_00148d7d:
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = pEVar1;
    }
  }
  else if (lVar3 == 3) {
    if (pEVar4[-2].m_registrationId != registrationId) {
      __position._M_current = pEVar4 + -1;
      goto LAB_00148d70;
    }
  }
  else {
    if (lVar3 != 2) goto LAB_00148d4c;
LAB_00148d70:
    if ((__position._M_current)->m_registrationId != registrationId) {
      __position._M_current = __position._M_current + 1;
      goto LAB_00148d7d;
    }
  }
LAB_00148d2c:
  if (__position._M_current != pEVar1) {
    DriverProxy::removePublication(this->m_driverProxy,registrationId);
    std::
    vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
    ::erase(&this->m_exclusivePublications,__position);
  }
LAB_00148d4c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_adminLock);
  return;
}

Assistant:

void ClientConductor::releaseExclusivePublication(std::int64_t registrationId)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_exclusivePublications.begin(), m_exclusivePublications.end(),
        [registrationId](const ExclusivePublicationStateDefn &entry)
        {
            return (registrationId == entry.m_registrationId);
        });

    if (it != m_exclusivePublications.end())
    {
        m_driverProxy.removePublication(registrationId);
        m_exclusivePublications.erase(it);
    }
}